

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_pathinfo(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  jx9_value *pArray;
  jx9_value *pVal;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  SyBlob *pBlob;
  path_info sInfo;
  int iLen;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pcVar3 = jx9_value_to_string(*apArg,&iLen);
    lVar8 = (long)iLen;
    if (0 < lVar8) {
      SyZero(&sInfo,0x40);
      if ((iLen == 1) && (*pcVar3 == '/')) {
        sInfo.sDir.zString = "/";
        sInfo.sDir.nByte = 1;
      }
      else {
        pcVar1 = pcVar3 + lVar8;
        do {
          pcVar6 = pcVar1 + -1;
          sInfo.sBasename.zString = pcVar3;
          if (pcVar6 <= pcVar3) break;
          sInfo.sBasename.zString = pcVar1;
          pcVar1 = pcVar6;
        } while (*pcVar6 != '/');
        sInfo.sDir.nByte = (uint)((long)sInfo.sBasename.zString - (long)pcVar3);
        sInfo.sDir.zString = pcVar3;
        if (sInfo.sDir.nByte < 2) {
          if (*pcVar3 == '/') {
            sInfo.sDir.zString = "/";
            sInfo.sDir.nByte = 1;
          }
        }
        else {
          uVar7 = (long)sInfo.sBasename.zString - (long)pcVar3 & 0xffffffff;
          uVar5 = sInfo.sDir.nByte;
          do {
            sInfo.sDir.nByte = uVar5;
            uVar7 = uVar7 - 1;
            if (uVar7 == 0xffffffffffffffff) break;
            uVar5 = (uint)uVar7;
          } while (pcVar3[uVar7 & 0xffffffff] == '/');
        }
        sInfo.sBasename.nByte = ((int)pcVar3 + iLen) - (int)sInfo.sBasename.zString;
        while (sInfo.sFilename.zString = sInfo.sBasename.zString, sInfo.sBasename.nByte != 0) {
          if (*sInfo.sBasename.zString != '/') {
            uVar5 = 0;
            pcVar3 = pcVar3 + lVar8;
            goto LAB_0013429e;
          }
          sInfo.sBasename.zString = sInfo.sBasename.zString + 1;
          sInfo.sBasename.nByte = sInfo.sBasename.nByte - 1;
        }
        sInfo.sFilename.nByte = 0;
      }
      goto LAB_00134175;
    }
  }
  goto switchD_001342f2_default;
  while (uVar5 = uVar4 + 1, *pcVar3 != '.') {
LAB_0013429e:
    pcVar1 = pcVar3;
    uVar4 = uVar5;
    pcVar3 = pcVar1 + -1;
    sInfo.sFilename.nByte = sInfo.sBasename.nByte;
    if (pcVar3 <= sInfo.sBasename.zString) goto LAB_00134175;
  }
  sInfo.sExtension.zString = pcVar1;
  sInfo.sExtension.nByte = uVar4;
  if (uVar4 < sInfo.sBasename.nByte) {
    sInfo.sFilename.nByte = sInfo.sBasename.nByte - (uVar4 + 1);
  }
LAB_00134175:
  if ((nArg == 1) || ((apArg[1]->iFlags & 2) == 0)) {
    pArray = jx9_context_new_array(pCtx);
    pVal = jx9_context_new_scalar(pCtx);
    if (pArray != (jx9_value *)0x0 && pVal != (jx9_value *)0x0) {
      if (sInfo.sDir.nByte != 0) {
        jx9_value_string(pVal,sInfo.sDir.zString,sInfo.sDir.nByte);
        jx9_array_add_strkey_elem(pArray,"dirname",pVal);
      }
      pBlob = &pVal->sBlob;
      SyBlobReset(pBlob);
      if (sInfo.sBasename.nByte != 0) {
        jx9_value_string(pVal,sInfo.sBasename.zString,sInfo.sBasename.nByte);
        jx9_array_add_strkey_elem(pArray,"basename",pVal);
      }
      SyBlobReset(pBlob);
      if (sInfo.sExtension.nByte != 0) {
        jx9_value_string(pVal,sInfo.sExtension.zString,sInfo.sExtension.nByte);
        jx9_array_add_strkey_elem(pArray,"extension",pVal);
      }
      SyBlobReset(pBlob);
      if (sInfo.sFilename.nByte != 0) {
        jx9_value_string(pVal,sInfo.sFilename.zString,sInfo.sFilename.nByte);
        jx9_array_add_strkey_elem(pArray,"filename",pVal);
      }
      jx9_result_value(pCtx,pArray);
      return 0;
    }
    jx9_result_bool(pCtx,0);
    return 0;
  }
  iVar2 = jx9_value_to_int(apArg[1]);
  switch(iVar2) {
  case 1:
    pcVar3 = sInfo.sDir.zString;
    uVar5 = sInfo.sDir.nByte;
    break;
  case 2:
    pcVar3 = sInfo.sBasename.zString;
    uVar5 = sInfo.sBasename.nByte;
    break;
  case 3:
    pcVar3 = sInfo.sExtension.zString;
    uVar5 = sInfo.sExtension.nByte;
    break;
  case 4:
    pcVar3 = sInfo.sFilename.zString;
    uVar5 = sInfo.sFilename.nByte;
    break;
  default:
    goto switchD_001342f2_default;
  }
  if (uVar5 != 0) goto LAB_0013433f;
switchD_001342f2_default:
  pcVar3 = "";
  uVar5 = 0;
LAB_0013433f:
  jx9_result_string(pCtx,pcVar3,uVar5);
  return 0;
}

Assistant:

static int jx9Builtin_pathinfo(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath;
	path_info sInfo;
	SyString *pComp;
	int iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Point to the target path */
	zPath = jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract path info */
	ExtractPathInfo(zPath, iLen, &sInfo);
	if( nArg > 1 && jx9_value_is_int(apArg[1]) ){
		/* Return path component */
		int nComp = jx9_value_to_int(apArg[1]);
		switch(nComp){
		case 1: /* PATHINFO_DIRNAME */
			pComp = &sInfo.sDir;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 2: /*PATHINFO_BASENAME*/
			pComp = &sInfo.sBasename;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 3: /*PATHINFO_EXTENSION*/
			pComp = &sInfo.sExtension;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		case 4: /*PATHINFO_FILENAME*/
			pComp = &sInfo.sFilename;
			if( pComp->nByte > 0 ){
				jx9_result_string(pCtx, pComp->zString, (int)pComp->nByte);
			}else{
				/* Expand the empty string */
				jx9_result_string(pCtx, "", 0);
			}
			break;
		default:
			/* Expand the empty string */
			jx9_result_string(pCtx, "", 0);
			break;
		}
	}else{
		/* Return an associative array */
		jx9_value *pArray, *pValue;
		pArray = jx9_context_new_array(pCtx);
		pValue = jx9_context_new_scalar(pCtx);
		if( pArray == 0 || pValue == 0 ){
			/* Out of mem, return NULL */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* dirname */
		pComp = &sInfo.sDir;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "dirname", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* basername */
		pComp = &sInfo.sBasename;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "basename", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* extension */
		pComp = &sInfo.sExtension;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "extension", pValue); /* Will make it's own copy */
		}
		/* Reset the string cursor */
		jx9_value_reset_string_cursor(pValue);
		/* filename */
		pComp = &sInfo.sFilename;
		if( pComp->nByte > 0 ){
			jx9_value_string(pValue, pComp->zString, (int)pComp->nByte);
			/* Perform the insertion */
			jx9_array_add_strkey_elem(pArray, "filename", pValue); /* Will make it's own copy */
		}
		/* Return the created array */
		jx9_result_value(pCtx, pArray);
		/* Don't worry about freeing memory, everything will be released
		 * automatically as soon we return from this foreign function.
		 */
	}
	return JX9_OK;
}